

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O2

pair<QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>::iterator,_bool>
* __thiscall
QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>
::try_emplace<>(pair<QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>::iterator,_bool>
                *__return_storage_ptr__,
               QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>
               *this,QString *key)

{
  bool bVar1;
  containers *pcVar2;
  iterator pQVar3;
  long lVar4;
  iterator iVar5;
  
  iVar5 = lower_bound(this,key);
  lVar4 = iVar5.i;
  pcVar2 = iVar5.c;
  if ((pcVar2 != &this->c) || (lVar4 != (this->c).keys.super_QVLABase<QString>.super_QVLABaseBase.s)
     ) {
    bVar1 = ::operator<(key,(QString *)
                            (lVar4 * 0x18 +
                            (long)(((containers *)&pcVar2->keys)->keys).super_QVLABase<QString>.
                                  super_QVLABaseBase.ptr));
    if (!bVar1) {
      bVar1 = false;
      goto LAB_00267572;
    }
  }
  QVarLengthArray<QIconTheme,_5LL>::emplace<>
            (&(this->c).values,
             (const_iterator)
             (lVar4 * 0x68 +
             (long)(this->c).values.super_QVLABase<QIconTheme>.super_QVLABaseBase.ptr));
  pQVar3 = QVarLengthArray<QString,_5LL>::insert
                     ((QVarLengthArray<QString,_5LL> *)this,
                      (const_iterator)
                      (lVar4 * 0x18 +
                      (long)(this->c).keys.super_QVLABase<QString>.super_QVLABaseBase.ptr),key);
  lVar4 = ((long)pQVar3 - (long)(this->c).keys.super_QVLABase<QString>.super_QVLABaseBase.ptr) /
          0x18;
  bVar1 = true;
  pcVar2 = &this->c;
LAB_00267572:
  (__return_storage_ptr__->first).c = pcVar2;
  (__return_storage_ptr__->first).i = lVar4;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }